

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,string *program)

{
  string local_40;
  
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001732a0;
  ::std::__cxx11::string::string((string *)&local_40,(string *)program);
  CommandReporter::CommandReporter
            (&this->super_CommandReporter,&local_40,&(this->launcher).super_CommandLauncher);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001732a0;
  SystemLauncher::SystemLauncher(&this->launcher,false,false);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const std::string& program)
        : CommandReporter(program, &launcher)
    {
    }